

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_lazy.c
# Opt level: O3

size_t ZSTD_compressBlock_lazy_extDict
                 (ZSTD_matchState_t *ms,seqStore_t *seqStore,U32 *rep,
                 ZSTD_compressionParameters *cParams,void *src,size_t srcSize)

{
  ulong *puVar1;
  ulong *puVar2;
  ulong *puVar3;
  ulong *iEnd;
  BYTE *iStart;
  ulong *puVar4;
  uint uVar5;
  uint uVar6;
  uint uVar7;
  BYTE *pBVar8;
  BYTE *pBVar9;
  U32 *pUVar10;
  long lVar11;
  int iVar12;
  uint uVar13;
  uint uVar14;
  ulong *puVar15;
  size_t sVar16;
  ulong uVar17;
  ulong uVar18;
  ulong uVar19;
  ulong *puVar20;
  BYTE *pBVar21;
  uint uVar22;
  ulong *puVar23;
  long lVar24;
  BYTE *pBVar25;
  seqDef *psVar26;
  BYTE *pBVar27;
  int iVar28;
  ulong *puVar29;
  uint uVar30;
  ulong uVar31;
  U32 UVar32;
  ulong *puVar33;
  uint uVar34;
  ulong uVar35;
  uint uVar36;
  BYTE *pStart;
  BYTE *pInLoopLimit;
  BYTE *pStart_3;
  uint local_15c;
  ulong local_158;
  BYTE *local_130;
  ulong local_128;
  ulong *local_e0;
  uint local_d4;
  int local_84;
  
  iEnd = (ulong *)((long)src + srcSize);
  puVar4 = (ulong *)((long)src + (srcSize - 8));
  pBVar8 = (ms->window).base;
  pBVar9 = (ms->window).dictBase;
  uVar5 = (ms->window).dictLimit;
  uVar6 = (ms->window).lowLimit;
  iStart = pBVar8 + uVar5;
  local_15c = *rep;
  local_d4 = rep[1];
  ms->nextToUpdate3 = ms->nextToUpdate;
  puVar33 = (ulong *)((ulong)(iStart == (BYTE *)src) + (long)src);
  if (puVar4 <= puVar33) {
LAB_00169849:
    *rep = local_15c;
    rep[1] = local_d4;
    return (long)iEnd - (long)src;
  }
  puVar15 = (ulong *)(pBVar9 + uVar5);
  iVar12 = uVar5 - 1;
  puVar1 = (ulong *)((long)iEnd - 7);
  puVar2 = (ulong *)((long)iEnd - 3);
  puVar3 = (ulong *)((long)iEnd - 1);
LAB_00168356:
  UVar32 = (U32)puVar33;
  local_84 = UVar32 - (int)pBVar8;
  uVar13 = (local_84 - local_15c) + 1;
  pBVar25 = pBVar8;
  if (uVar13 < uVar5) {
    pBVar25 = pBVar9;
  }
  if ((uVar6 < uVar13 && 2 < iVar12 - uVar13) &&
     (*(int *)((long)puVar33 + 1U) == *(int *)(pBVar25 + uVar13))) {
    puVar23 = iEnd;
    if (uVar13 < uVar5) {
      puVar23 = puVar15;
    }
    sVar16 = ZSTD_count_2segments
                       ((BYTE *)((long)puVar33 + 5),(BYTE *)((long)(pBVar25 + uVar13) + 4),
                        (BYTE *)iEnd,(BYTE *)puVar23,iStart);
    uVar17 = sVar16 + 4;
  }
  else {
    uVar17 = 0;
  }
  if (cParams->searchLength - 6 < 2) {
    pUVar10 = ms->chainTable;
    uVar34 = 1 << ((byte)cParams->chainLog & 0x1f);
    pBVar25 = (ms->window).base;
    pBVar21 = (ms->window).dictBase;
    uVar13 = (ms->window).dictLimit;
    uVar22 = (ms->window).lowLimit;
    uVar36 = UVar32 - (int)pBVar25;
    uVar30 = uVar36 - uVar34;
    if (uVar36 < uVar34) {
      uVar30 = 0;
    }
    uVar7 = cParams->searchLog;
    uVar14 = ZSTD_insertAndFindFirstIndex_internal
                       (ms,(ZSTD_compressionParameters *)(ulong)cParams->chainLog,
                        (BYTE *)(ulong)cParams->hashLog,UVar32);
    if (uVar22 < uVar14) {
      iVar28 = 1 << ((byte)uVar7 & 0x1f);
      local_128 = 99999999;
      local_158 = 3;
      do {
        uVar18 = (ulong)uVar14;
        if (uVar14 < uVar13) {
          if (*(int *)(pBVar21 + uVar18) == (int)*puVar33) {
            sVar16 = ZSTD_count_2segments
                               ((BYTE *)((long)puVar33 + 4),pBVar21 + uVar18 + 4,(BYTE *)iEnd,
                                pBVar21 + uVar13,pBVar25 + uVar13);
            uVar18 = sVar16 + 4;
LAB_0016863d:
            if ((local_158 < uVar18) &&
               (local_128 = (ulong)((uVar36 + 2) - uVar14), local_158 = uVar18,
               (ulong *)((long)puVar33 + uVar18) == iEnd)) goto LAB_00168bc9;
          }
        }
        else {
          puVar23 = (ulong *)(pBVar25 + uVar18);
          if (*(BYTE *)(local_158 + (long)puVar23) == *(BYTE *)((long)puVar33 + local_158)) {
            puVar20 = puVar33;
            if (puVar33 < puVar1) {
              if (*puVar23 == *puVar33) {
                lVar24 = 0;
                do {
                  puVar20 = (ulong *)((long)puVar33 + lVar24 + 8);
                  if (puVar1 <= puVar20) {
                    puVar23 = (ulong *)(pBVar25 + lVar24 + uVar18 + 8);
                    goto LAB_001685f7;
                  }
                  lVar11 = lVar24 + uVar18 + 8;
                  lVar24 = lVar24 + 8;
                } while (*(ulong *)(pBVar25 + lVar11) == *puVar20);
                uVar19 = *puVar20 ^ *(ulong *)(pBVar25 + lVar11);
                uVar18 = 0;
                if (uVar19 != 0) {
                  for (; (uVar19 >> uVar18 & 1) == 0; uVar18 = uVar18 + 1) {
                  }
                }
                uVar18 = (uVar18 >> 3 & 0x1fffffff) + lVar24;
              }
              else {
                uVar19 = *puVar33 ^ *puVar23;
                uVar18 = 0;
                if (uVar19 != 0) {
                  for (; (uVar19 >> uVar18 & 1) == 0; uVar18 = uVar18 + 1) {
                  }
                }
                uVar18 = uVar18 >> 3 & 0x1fffffff;
              }
            }
            else {
LAB_001685f7:
              if ((puVar20 < puVar2) && ((int)*puVar23 == (int)*puVar20)) {
                puVar20 = (ulong *)((long)puVar20 + 4);
                puVar23 = (ulong *)((long)puVar23 + 4);
              }
              if ((puVar20 < puVar3) && ((short)*puVar23 == (short)*puVar20)) {
                puVar20 = (ulong *)((long)puVar20 + 2);
                puVar23 = (ulong *)((long)puVar23 + 2);
              }
              if (puVar20 < iEnd) {
                puVar20 = (ulong *)((long)puVar20 + (ulong)((BYTE)*puVar23 == (BYTE)*puVar20));
              }
              uVar18 = (long)puVar20 - (long)puVar33;
            }
            goto LAB_0016863d;
          }
        }
        if ((uVar14 <= uVar30) ||
           ((uVar14 = pUVar10[uVar14 & uVar34 - 1], uVar14 <= uVar22 ||
            (iVar28 = iVar28 + -1, iVar28 == 0)))) goto LAB_00168bc9;
      } while( true );
    }
  }
  else if (cParams->searchLength == 5) {
    pUVar10 = ms->chainTable;
    uVar34 = 1 << ((byte)cParams->chainLog & 0x1f);
    pBVar25 = (ms->window).base;
    pBVar21 = (ms->window).dictBase;
    uVar13 = (ms->window).dictLimit;
    uVar22 = (ms->window).lowLimit;
    uVar36 = UVar32 - (int)pBVar25;
    uVar30 = uVar36 - uVar34;
    if (uVar36 < uVar34) {
      uVar30 = 0;
    }
    uVar7 = cParams->searchLog;
    uVar14 = ZSTD_insertAndFindFirstIndex_internal
                       (ms,(ZSTD_compressionParameters *)(ulong)cParams->chainLog,
                        (BYTE *)(ulong)cParams->hashLog,UVar32);
    if (uVar22 < uVar14) {
      iVar28 = 1 << ((byte)uVar7 & 0x1f);
      local_128 = 99999999;
      local_158 = 3;
      do {
        uVar18 = (ulong)uVar14;
        if (uVar14 < uVar13) {
          if (*(int *)(pBVar21 + uVar18) == (int)*puVar33) {
            sVar16 = ZSTD_count_2segments
                               ((BYTE *)((long)puVar33 + 4),pBVar21 + uVar18 + 4,(BYTE *)iEnd,
                                pBVar21 + uVar13,pBVar25 + uVar13);
            uVar18 = sVar16 + 4;
LAB_001688d9:
            if ((local_158 < uVar18) &&
               (local_128 = (ulong)((uVar36 + 2) - uVar14), local_158 = uVar18,
               (ulong *)((long)puVar33 + uVar18) == iEnd)) goto LAB_00168bc9;
          }
        }
        else {
          puVar23 = (ulong *)(pBVar25 + uVar18);
          if (*(BYTE *)(local_158 + (long)puVar23) == *(BYTE *)((long)puVar33 + local_158)) {
            puVar20 = puVar33;
            if (puVar33 < puVar1) {
              if (*puVar23 == *puVar33) {
                lVar24 = 0;
                do {
                  puVar20 = (ulong *)((long)puVar33 + lVar24 + 8);
                  if (puVar1 <= puVar20) {
                    puVar23 = (ulong *)(pBVar25 + lVar24 + uVar18 + 8);
                    goto LAB_00168893;
                  }
                  lVar11 = lVar24 + uVar18 + 8;
                  lVar24 = lVar24 + 8;
                } while (*(ulong *)(pBVar25 + lVar11) == *puVar20);
                uVar19 = *puVar20 ^ *(ulong *)(pBVar25 + lVar11);
                uVar18 = 0;
                if (uVar19 != 0) {
                  for (; (uVar19 >> uVar18 & 1) == 0; uVar18 = uVar18 + 1) {
                  }
                }
                uVar18 = (uVar18 >> 3 & 0x1fffffff) + lVar24;
              }
              else {
                uVar19 = *puVar33 ^ *puVar23;
                uVar18 = 0;
                if (uVar19 != 0) {
                  for (; (uVar19 >> uVar18 & 1) == 0; uVar18 = uVar18 + 1) {
                  }
                }
                uVar18 = uVar18 >> 3 & 0x1fffffff;
              }
            }
            else {
LAB_00168893:
              if ((puVar20 < puVar2) && ((int)*puVar23 == (int)*puVar20)) {
                puVar20 = (ulong *)((long)puVar20 + 4);
                puVar23 = (ulong *)((long)puVar23 + 4);
              }
              if ((puVar20 < puVar3) && ((short)*puVar23 == (short)*puVar20)) {
                puVar20 = (ulong *)((long)puVar20 + 2);
                puVar23 = (ulong *)((long)puVar23 + 2);
              }
              if (puVar20 < iEnd) {
                puVar20 = (ulong *)((long)puVar20 + (ulong)((BYTE)*puVar23 == (BYTE)*puVar20));
              }
              uVar18 = (long)puVar20 - (long)puVar33;
            }
            goto LAB_001688d9;
          }
        }
        if ((uVar14 <= uVar30) ||
           ((uVar14 = pUVar10[uVar14 & uVar34 - 1], uVar14 <= uVar22 ||
            (iVar28 = iVar28 + -1, iVar28 == 0)))) goto LAB_00168bc9;
      } while( true );
    }
  }
  else {
    pUVar10 = ms->chainTable;
    uVar34 = 1 << ((byte)cParams->chainLog & 0x1f);
    pBVar25 = (ms->window).base;
    pBVar21 = (ms->window).dictBase;
    uVar13 = (ms->window).dictLimit;
    uVar22 = (ms->window).lowLimit;
    uVar36 = UVar32 - (int)pBVar25;
    uVar30 = uVar36 - uVar34;
    if (uVar36 < uVar34) {
      uVar30 = 0;
    }
    uVar7 = cParams->searchLog;
    uVar14 = ZSTD_insertAndFindFirstIndex_internal
                       (ms,(ZSTD_compressionParameters *)(ulong)cParams->chainLog,
                        (BYTE *)(ulong)cParams->hashLog,UVar32);
    if (uVar22 < uVar14) {
      iVar28 = 1 << ((byte)uVar7 & 0x1f);
      local_128 = 99999999;
      local_158 = 3;
      do {
        uVar18 = (ulong)uVar14;
        if (uVar14 < uVar13) {
          if (*(int *)(pBVar21 + uVar18) == (int)*puVar33) {
            sVar16 = ZSTD_count_2segments
                               ((BYTE *)((long)puVar33 + 4),pBVar21 + uVar18 + 4,(BYTE *)iEnd,
                                pBVar21 + uVar13,pBVar25 + uVar13);
            uVar18 = sVar16 + 4;
LAB_00168b6c:
            if ((local_158 < uVar18) &&
               (local_128 = (ulong)((uVar36 + 2) - uVar14), local_158 = uVar18,
               (ulong *)((long)puVar33 + uVar18) == iEnd)) goto LAB_00168bc9;
          }
        }
        else {
          puVar23 = (ulong *)(pBVar25 + uVar18);
          if (*(BYTE *)(local_158 + (long)puVar23) == *(BYTE *)((long)puVar33 + local_158)) {
            puVar20 = puVar33;
            if (puVar33 < puVar1) {
              if (*puVar23 == *puVar33) {
                lVar24 = 0;
                do {
                  puVar20 = (ulong *)((long)puVar33 + lVar24 + 8);
                  if (puVar1 <= puVar20) {
                    puVar23 = (ulong *)(pBVar25 + lVar24 + uVar18 + 8);
                    goto LAB_00168b26;
                  }
                  lVar11 = lVar24 + uVar18 + 8;
                  lVar24 = lVar24 + 8;
                } while (*(ulong *)(pBVar25 + lVar11) == *puVar20);
                uVar19 = *puVar20 ^ *(ulong *)(pBVar25 + lVar11);
                uVar18 = 0;
                if (uVar19 != 0) {
                  for (; (uVar19 >> uVar18 & 1) == 0; uVar18 = uVar18 + 1) {
                  }
                }
                uVar18 = (uVar18 >> 3 & 0x1fffffff) + lVar24;
              }
              else {
                uVar19 = *puVar33 ^ *puVar23;
                uVar18 = 0;
                if (uVar19 != 0) {
                  for (; (uVar19 >> uVar18 & 1) == 0; uVar18 = uVar18 + 1) {
                  }
                }
                uVar18 = uVar18 >> 3 & 0x1fffffff;
              }
            }
            else {
LAB_00168b26:
              if ((puVar20 < puVar2) && ((int)*puVar23 == (int)*puVar20)) {
                puVar20 = (ulong *)((long)puVar20 + 4);
                puVar23 = (ulong *)((long)puVar23 + 4);
              }
              if ((puVar20 < puVar3) && ((short)*puVar23 == (short)*puVar20)) {
                puVar20 = (ulong *)((long)puVar20 + 2);
                puVar23 = (ulong *)((long)puVar23 + 2);
              }
              if (puVar20 < iEnd) {
                puVar20 = (ulong *)((long)puVar20 + (ulong)((BYTE)*puVar23 == (BYTE)*puVar20));
              }
              uVar18 = (long)puVar20 - (long)puVar33;
            }
            goto LAB_00168b6c;
          }
        }
        if ((uVar14 <= uVar30) ||
           ((uVar14 = pUVar10[uVar14 & uVar34 - 1], uVar14 <= uVar22 ||
            (iVar28 = iVar28 + -1, iVar28 == 0)))) goto LAB_00168bc9;
      } while( true );
    }
  }
  local_128 = 99999999;
  local_158 = 3;
LAB_00168bc9:
  uVar18 = uVar17;
  if (uVar17 < local_158) {
    uVar18 = local_158;
  }
  if (3 < uVar18) {
    puVar23 = puVar33;
    if (local_158 <= uVar17) {
      local_128 = 0;
      puVar23 = (ulong *)((long)puVar33 + 1U);
    }
    local_130 = (BYTE *)((long)puVar33 + 9);
LAB_00168c4b:
    local_e0 = puVar23;
    uVar19 = local_128;
    uVar17 = uVar18;
    if (puVar33 < puVar4) {
      puVar23 = (ulong *)((long)puVar33 + 1);
      local_84 = local_84 + 1;
      if (uVar19 == 0) {
        uVar19 = 0;
      }
      else {
        uVar13 = local_84 - local_15c;
        pBVar25 = pBVar8;
        if (uVar13 < uVar5) {
          pBVar25 = pBVar9;
        }
        if ((uVar6 < uVar13 && 2 < iVar12 - uVar13) &&
           (*(int *)puVar23 == *(int *)(pBVar25 + uVar13))) {
          puVar20 = iEnd;
          if (uVar13 < uVar5) {
            puVar20 = puVar15;
          }
          sVar16 = ZSTD_count_2segments
                             ((BYTE *)((long)puVar33 + 5),(BYTE *)((long)(pBVar25 + uVar13) + 4),
                              (BYTE *)iEnd,(BYTE *)puVar20,iStart);
          if (sVar16 < 0xfffffffffffffffc) {
            uVar22 = (int)uVar19 + 1;
            uVar13 = 0x1f;
            if (uVar22 != 0) {
              for (; uVar22 >> uVar13 == 0; uVar13 = uVar13 - 1) {
              }
            }
            if ((int)((uVar13 ^ 0x1f) + (int)uVar18 * 3 + -0x1e) < (int)(sVar16 + 4) * 3) {
              uVar19 = 0;
              uVar17 = sVar16 + 4;
              local_e0 = puVar23;
            }
          }
        }
      }
      UVar32 = (U32)puVar23;
      if (cParams->searchLength - 6 < 2) {
        pUVar10 = ms->chainTable;
        uVar30 = 1 << ((byte)cParams->chainLog & 0x1f);
        pBVar25 = (ms->window).base;
        pBVar21 = (ms->window).dictBase;
        uVar13 = (ms->window).dictLimit;
        uVar22 = (ms->window).lowLimit;
        uVar34 = UVar32 - (int)pBVar25;
        uVar36 = uVar34 - uVar30;
        if (uVar34 < uVar30) {
          uVar36 = 0;
        }
        uVar7 = cParams->searchLog;
        uVar14 = ZSTD_insertAndFindFirstIndex_internal
                           (ms,(ZSTD_compressionParameters *)(ulong)cParams->chainLog,
                            (BYTE *)(ulong)cParams->hashLog,UVar32);
        if (uVar22 < uVar14) {
          iVar28 = 1 << ((byte)uVar7 & 0x1f);
          local_128 = 99999999;
          uVar35 = 3;
          do {
            uVar18 = (ulong)uVar14;
            if (uVar14 < uVar13) {
              if (*(int *)(pBVar21 + uVar18) == *(int *)puVar23) {
                sVar16 = ZSTD_count_2segments
                                   ((BYTE *)((long)puVar33 + 5),pBVar21 + uVar18 + 4,(BYTE *)iEnd,
                                    pBVar21 + uVar13,pBVar25 + uVar13);
                uVar18 = sVar16 + 4;
LAB_00168f91:
                if ((uVar35 < uVar18) &&
                   (local_128 = (ulong)((uVar34 + 2) - uVar14), uVar35 = uVar18,
                   (ulong *)((long)puVar23 + uVar18) == iEnd)) goto LAB_001694e9;
              }
            }
            else {
              puVar20 = (ulong *)(pBVar25 + uVar18);
              if (*(BYTE *)(uVar35 + (long)puVar20) == *(BYTE *)((long)puVar23 + uVar35)) {
                puVar29 = puVar23;
                if (puVar23 < puVar1) {
                  if (*puVar20 == *puVar23) {
                    lVar24 = 0;
                    do {
                      puVar29 = (ulong *)(local_130 + lVar24);
                      if (puVar1 <= puVar29) {
                        puVar20 = (ulong *)(pBVar25 + lVar24 + uVar18 + 8);
                        goto LAB_00168f44;
                      }
                      lVar11 = lVar24 + uVar18 + 8;
                      lVar24 = lVar24 + 8;
                    } while (*(ulong *)(pBVar25 + lVar11) == *puVar29);
                    uVar31 = *puVar29 ^ *(ulong *)(pBVar25 + lVar11);
                    uVar18 = 0;
                    if (uVar31 != 0) {
                      for (; (uVar31 >> uVar18 & 1) == 0; uVar18 = uVar18 + 1) {
                      }
                    }
                    uVar18 = (uVar18 >> 3 & 0x1fffffff) + lVar24;
                  }
                  else {
                    uVar31 = *puVar23 ^ *puVar20;
                    uVar18 = 0;
                    if (uVar31 != 0) {
                      for (; (uVar31 >> uVar18 & 1) == 0; uVar18 = uVar18 + 1) {
                      }
                    }
                    uVar18 = uVar18 >> 3 & 0x1fffffff;
                  }
                }
                else {
LAB_00168f44:
                  if ((puVar29 < puVar2) && ((int)*puVar20 == (int)*puVar29)) {
                    puVar29 = (ulong *)((long)puVar29 + 4);
                    puVar20 = (ulong *)((long)puVar20 + 4);
                  }
                  if ((puVar29 < puVar3) && ((short)*puVar20 == (short)*puVar29)) {
                    puVar29 = (ulong *)((long)puVar29 + 2);
                    puVar20 = (ulong *)((long)puVar20 + 2);
                  }
                  if (puVar29 < iEnd) {
                    puVar29 = (ulong *)((long)puVar29 + (ulong)((BYTE)*puVar20 == (BYTE)*puVar29));
                  }
                  uVar18 = (long)puVar29 - (long)puVar23;
                }
                goto LAB_00168f91;
              }
            }
            uVar18 = uVar35;
            if ((uVar14 <= uVar36) ||
               ((uVar14 = pUVar10[uVar14 & uVar30 - 1], uVar14 <= uVar22 ||
                (iVar28 = iVar28 + -1, uVar35 = uVar18, iVar28 == 0)))) goto LAB_001694e9;
          } while( true );
        }
      }
      else if (cParams->searchLength == 5) {
        pUVar10 = ms->chainTable;
        uVar36 = 1 << ((byte)cParams->chainLog & 0x1f);
        pBVar25 = (ms->window).base;
        pBVar21 = (ms->window).dictBase;
        uVar13 = (ms->window).dictLimit;
        uVar22 = (ms->window).lowLimit;
        uVar34 = UVar32 - (int)pBVar25;
        uVar30 = uVar34 - uVar36;
        if (uVar34 < uVar36) {
          uVar30 = 0;
        }
        uVar7 = cParams->searchLog;
        uVar14 = ZSTD_insertAndFindFirstIndex_internal
                           (ms,(ZSTD_compressionParameters *)(ulong)cParams->chainLog,
                            (BYTE *)(ulong)cParams->hashLog,UVar32);
        if (uVar22 < uVar14) {
          iVar28 = 1 << ((byte)uVar7 & 0x1f);
          local_128 = 99999999;
          uVar35 = 3;
          do {
            uVar18 = (ulong)uVar14;
            if (uVar14 < uVar13) {
              if (*(int *)(pBVar21 + uVar18) == *(int *)puVar23) {
                sVar16 = ZSTD_count_2segments
                                   ((BYTE *)((long)puVar33 + 5),pBVar21 + uVar18 + 4,(BYTE *)iEnd,
                                    pBVar21 + uVar13,pBVar25 + uVar13);
                uVar18 = sVar16 + 4;
LAB_00169219:
                if ((uVar35 < uVar18) &&
                   (local_128 = (ulong)((uVar34 + 2) - uVar14), uVar35 = uVar18,
                   (ulong *)((long)puVar23 + uVar18) == iEnd)) goto LAB_001694e9;
              }
            }
            else {
              puVar20 = (ulong *)(pBVar25 + uVar18);
              if (*(BYTE *)(uVar35 + (long)puVar20) == *(BYTE *)((long)puVar23 + uVar35)) {
                puVar29 = puVar23;
                if (puVar23 < puVar1) {
                  if (*puVar20 == *puVar23) {
                    lVar24 = 0;
                    do {
                      if (puVar1 <= local_130 + lVar24) {
                        puVar20 = (ulong *)(pBVar25 + lVar24 + uVar18 + 8);
                        puVar29 = (ulong *)(local_130 + lVar24);
                        goto LAB_001691d0;
                      }
                      lVar11 = lVar24 + uVar18 + 8;
                      uVar31 = *(ulong *)((long)puVar33 + lVar24 + 9);
                      lVar24 = lVar24 + 8;
                    } while (*(ulong *)(pBVar25 + lVar11) == uVar31);
                    uVar31 = uVar31 ^ *(ulong *)(pBVar25 + lVar11);
                    uVar18 = 0;
                    if (uVar31 != 0) {
                      for (; (uVar31 >> uVar18 & 1) == 0; uVar18 = uVar18 + 1) {
                      }
                    }
                    uVar18 = (uVar18 >> 3 & 0x1fffffff) + lVar24;
                  }
                  else {
                    uVar31 = *puVar23 ^ *puVar20;
                    uVar18 = 0;
                    if (uVar31 != 0) {
                      for (; (uVar31 >> uVar18 & 1) == 0; uVar18 = uVar18 + 1) {
                      }
                    }
                    uVar18 = uVar18 >> 3 & 0x1fffffff;
                  }
                }
                else {
LAB_001691d0:
                  if ((puVar29 < puVar2) && ((int)*puVar20 == (int)*puVar29)) {
                    puVar29 = (ulong *)((long)puVar29 + 4);
                    puVar20 = (ulong *)((long)puVar20 + 4);
                  }
                  if ((puVar29 < puVar3) && ((short)*puVar20 == (short)*puVar29)) {
                    puVar29 = (ulong *)((long)puVar29 + 2);
                    puVar20 = (ulong *)((long)puVar20 + 2);
                  }
                  if (puVar29 < iEnd) {
                    puVar29 = (ulong *)((long)puVar29 + (ulong)((BYTE)*puVar20 == (BYTE)*puVar29));
                  }
                  uVar18 = (long)puVar29 - (long)puVar23;
                }
                goto LAB_00169219;
              }
            }
            uVar18 = uVar35;
            if ((uVar14 <= uVar30) ||
               ((uVar14 = pUVar10[uVar14 & uVar36 - 1], uVar14 <= uVar22 ||
                (iVar28 = iVar28 + -1, uVar35 = uVar18, iVar28 == 0)))) goto LAB_001694e9;
          } while( true );
        }
      }
      else {
        pUVar10 = ms->chainTable;
        uVar36 = 1 << ((byte)cParams->chainLog & 0x1f);
        pBVar25 = (ms->window).base;
        pBVar21 = (ms->window).dictBase;
        uVar13 = (ms->window).dictLimit;
        uVar22 = (ms->window).lowLimit;
        uVar30 = UVar32 - (int)pBVar25;
        uVar34 = uVar30 - uVar36;
        if (uVar30 < uVar36) {
          uVar34 = 0;
        }
        uVar7 = cParams->searchLog;
        uVar14 = ZSTD_insertAndFindFirstIndex_internal
                           (ms,(ZSTD_compressionParameters *)(ulong)cParams->chainLog,
                            (BYTE *)(ulong)cParams->hashLog,UVar32);
        if (uVar22 < uVar14) {
          iVar28 = 1 << ((byte)uVar7 & 0x1f);
          local_128 = 99999999;
          uVar35 = 3;
          do {
            uVar18 = (ulong)uVar14;
            if (uVar14 < uVar13) {
              if (*(int *)(pBVar21 + uVar18) == *(int *)puVar23) {
                sVar16 = ZSTD_count_2segments
                                   ((BYTE *)((long)puVar33 + 5),pBVar21 + uVar18 + 4,(BYTE *)iEnd,
                                    pBVar21 + uVar13,pBVar25 + uVar13);
                uVar18 = sVar16 + 4;
LAB_001694a9:
                if ((uVar35 < uVar18) &&
                   (local_128 = (ulong)((uVar30 + 2) - uVar14), uVar35 = uVar18,
                   (ulong *)((long)puVar23 + uVar18) == iEnd)) goto LAB_001694e9;
              }
            }
            else {
              puVar20 = (ulong *)(pBVar25 + uVar18);
              if (*(BYTE *)(uVar35 + (long)puVar20) == *(BYTE *)((long)puVar23 + uVar35)) {
                puVar29 = puVar23;
                if (puVar23 < puVar1) {
                  if (*puVar20 == *puVar23) {
                    lVar24 = 0;
                    do {
                      puVar29 = (ulong *)(local_130 + lVar24);
                      if (puVar1 <= puVar29) {
                        puVar20 = (ulong *)(pBVar25 + lVar24 + uVar18 + 8);
                        goto LAB_0016945c;
                      }
                      lVar11 = lVar24 + uVar18 + 8;
                      lVar24 = lVar24 + 8;
                    } while (*(ulong *)(pBVar25 + lVar11) == *puVar29);
                    uVar31 = *puVar29 ^ *(ulong *)(pBVar25 + lVar11);
                    uVar18 = 0;
                    if (uVar31 != 0) {
                      for (; (uVar31 >> uVar18 & 1) == 0; uVar18 = uVar18 + 1) {
                      }
                    }
                    uVar18 = (uVar18 >> 3 & 0x1fffffff) + lVar24;
                  }
                  else {
                    uVar31 = *puVar23 ^ *puVar20;
                    uVar18 = 0;
                    if (uVar31 != 0) {
                      for (; (uVar31 >> uVar18 & 1) == 0; uVar18 = uVar18 + 1) {
                      }
                    }
                    uVar18 = uVar18 >> 3 & 0x1fffffff;
                  }
                }
                else {
LAB_0016945c:
                  if ((puVar29 < puVar2) && ((int)*puVar20 == (int)*puVar29)) {
                    puVar29 = (ulong *)((long)puVar29 + 4);
                    puVar20 = (ulong *)((long)puVar20 + 4);
                  }
                  if ((puVar29 < puVar3) && ((short)*puVar20 == (short)*puVar29)) {
                    puVar29 = (ulong *)((long)puVar29 + 2);
                    puVar20 = (ulong *)((long)puVar20 + 2);
                  }
                  if (puVar29 < iEnd) {
                    puVar29 = (ulong *)((long)puVar29 + (ulong)((BYTE)*puVar20 == (BYTE)*puVar29));
                  }
                  uVar18 = (long)puVar29 - (long)puVar23;
                }
                goto LAB_001694a9;
              }
            }
            uVar18 = uVar35;
            if ((uVar14 <= uVar34) ||
               ((uVar14 = pUVar10[uVar14 & uVar36 - 1], uVar14 <= uVar22 ||
                (iVar28 = iVar28 + -1, uVar35 = uVar18, iVar28 == 0)))) goto LAB_001694e9;
          } while( true );
        }
      }
    }
    goto LAB_00169592;
  }
  puVar33 = (ulong *)((long)puVar33 + ((long)puVar33 - (long)src >> 8) + 1);
  goto LAB_0016981a;
LAB_001694e9:
  if (uVar18 < 4) goto LAB_00169592;
  uVar22 = (int)uVar19 + 1;
  uVar13 = 0x1f;
  if (uVar22 != 0) {
    for (; uVar22 >> uVar13 == 0; uVar13 = uVar13 - 1) {
    }
  }
  uVar22 = (int)local_128 + 1;
  iVar28 = 0x1f;
  if (uVar22 != 0) {
    for (; uVar22 >> iVar28 == 0; iVar28 = iVar28 + -1) {
    }
  }
  local_130 = local_130 + 1;
  puVar33 = puVar23;
  if ((int)uVar18 * 4 - iVar28 <= (int)((uVar13 ^ 0x1f) + (int)uVar17 * 4 + -0x1b))
  goto LAB_00169592;
  goto LAB_00168c4b;
LAB_00169592:
  if (uVar19 == 0) {
    UVar32 = 1;
  }
  else {
    pBVar27 = (BYTE *)((long)local_e0 + (2 - (long)(pBVar8 + uVar19)));
    pBVar21 = iStart;
    pBVar25 = pBVar8;
    if ((uint)pBVar27 < uVar5) {
      pBVar21 = pBVar9 + uVar6;
      pBVar25 = pBVar9;
    }
    if ((src < local_e0) && (uVar18 = (ulong)pBVar27 & 0xffffffff, pBVar21 < pBVar25 + uVar18)) {
      pBVar25 = pBVar25 + uVar18;
      do {
        puVar33 = (ulong *)((long)local_e0 + -1);
        pBVar25 = pBVar25 + -1;
        if ((*(BYTE *)puVar33 != *pBVar25) ||
           (uVar17 = uVar17 + 1, local_e0 = puVar33, puVar33 <= src)) break;
      } while (pBVar21 < pBVar25);
    }
    local_d4 = local_15c;
    local_15c = (int)uVar19 - 2;
    UVar32 = (int)uVar19 + 1;
  }
  uVar18 = (long)local_e0 - (long)src;
  puVar23 = (ulong *)seqStore->lit;
  puVar33 = (ulong *)((long)puVar23 + uVar18);
  do {
    *puVar23 = *src;
    puVar23 = puVar23 + 1;
    src = (void *)((long)src + 8);
  } while (puVar23 < puVar33);
  seqStore->lit = seqStore->lit + uVar18;
  if (uVar18 < 0x10000) {
    psVar26 = seqStore->sequences;
  }
  else {
    seqStore->longLengthID = 1;
    psVar26 = seqStore->sequences;
    seqStore->longLengthPos = (U32)((ulong)((long)psVar26 - (long)seqStore->sequencesStart) >> 3);
  }
  psVar26->litLength = (U16)uVar18;
  psVar26->offset = UVar32;
  if (0xffff < uVar17 - 3) {
    seqStore->longLengthID = 2;
    seqStore->longLengthPos = (U32)((ulong)((long)psVar26 - (long)seqStore->sequencesStart) >> 3);
  }
  psVar26->matchLength = (U16)(uVar17 - 3);
  seqStore->sequences = psVar26 + 1;
  uVar13 = local_15c;
  for (puVar33 = (ulong *)((long)local_e0 + uVar17); local_15c = uVar13, src = puVar33,
      puVar33 <= puVar4; puVar33 = (ulong *)((long)puVar33 + sVar16 + 4)) {
    uVar13 = (uint)((long)puVar33 - (long)(pBVar8 + local_d4));
    pBVar25 = pBVar8;
    if (uVar13 < uVar5) {
      pBVar25 = pBVar9;
    }
    if (((uVar13 <= uVar6) || (iVar12 - uVar13 < 3)) ||
       ((int)*puVar33 !=
        *(int *)(pBVar25 + ((long)puVar33 - (long)(pBVar8 + local_d4) & 0xffffffff)))) break;
    puVar23 = iEnd;
    if (uVar13 < uVar5) {
      puVar23 = puVar15;
    }
    sVar16 = ZSTD_count_2segments
                       ((BYTE *)((long)puVar33 + 4),
                        (BYTE *)((long)(pBVar25 +
                                       ((long)puVar33 - (long)(pBVar8 + local_d4) & 0xffffffff)) + 4
                                ),(BYTE *)iEnd,(BYTE *)puVar23,iStart);
    *(ulong *)seqStore->lit = *puVar33;
    psVar26 = seqStore->sequences;
    psVar26->litLength = 0;
    psVar26->offset = 1;
    if (0xffff < sVar16 + 1) {
      seqStore->longLengthID = 2;
      seqStore->longLengthPos = (U32)((ulong)((long)psVar26 - (long)seqStore->sequencesStart) >> 3);
    }
    psVar26->matchLength = (U16)(sVar16 + 1);
    seqStore->sequences = psVar26 + 1;
    uVar13 = local_d4;
    local_d4 = local_15c;
  }
LAB_0016981a:
  if (puVar4 <= puVar33) goto LAB_00169849;
  goto LAB_00168356;
}

Assistant:

size_t ZSTD_compressBlock_lazy_extDict(
        ZSTD_matchState_t* ms, seqStore_t* seqStore, U32 rep[ZSTD_REP_NUM],
        ZSTD_compressionParameters const* cParams, void const* src, size_t srcSize)

{
    return ZSTD_compressBlock_lazy_extDict_generic(ms, seqStore, rep, cParams, src, srcSize, 0, 1);
}